

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_string(char *text,int text_len,int posX,int posY,int fontSize,rf_color color)

{
  ulong uVar1;
  rf_vec2 position;
  
  if ((text_len != 0) && ((rf__ctx->field_0).default_font.texture.id != 0)) {
    position.x = (float)posX;
    position.y = (float)posY;
    uVar1 = 10;
    if (10 < fontSize) {
      uVar1 = (ulong)(uint)fontSize;
    }
    rf_draw_string_ex((rf__ctx->field_0).default_font,text,text_len,position,(float)(int)uVar1,
                      (float)(uint)(uVar1 * 0x66666667 >> 0x22),color);
  }
  return;
}

Assistant:

RF_API void rf_draw_string(const char* text, int text_len, int posX, int posY, int fontSize, rf_color color)
{
    // Check if default font has been loaded
    if (rf_get_default_font().texture.id == 0 || text_len == 0) return;

    rf_vec2 position = { (float)posX, (float)posY };

    int defaultFontSize = 10;   // Default Font chars height in pixel
    if (fontSize < defaultFontSize) fontSize = defaultFontSize;
    int spacing = fontSize/defaultFontSize;

    rf_draw_string_ex(rf_get_default_font(), text, text_len, position, (float)fontSize, (float)spacing, color);
}